

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon_triangulation.cc
# Opt level: O3

void __thiscall PolygonTriangulation::trapezoidal_decomposition(PolygonTriangulation *this)

{
  uint32_t segment_index;
  
  init_permutation_table(this);
  init_query_structure(this);
  while ((this->permutation_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (this->permutation_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
    segment_index = new_random_segment_index(this);
    add_segment_to_query_structure(this,segment_index);
  }
  return;
}

Assistant:

void PolygonTriangulation::trapezoidal_decomposition()
{
  /// Note :
  /// Seidel's is a bit differents than that,
  /// it use two loops to construct the trapezoidation in log*(n) with some tricks.

  init_permutation_table();
  init_query_structure();

  while (!permutation_.empty()) {
    add_segment_to_query_structure(new_random_segment_index());
  }
}